

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O3

void __thiscall CStructure::CopyLabel(CStructure *this,char *nnaam,aint offset)

{
  int iVar1;
  CStructureEntry1 *pCVar2;
  char *pcVar3;
  CStructureEntry1 **ppCVar4;
  
  pCVar2 = (CStructureEntry1 *)operator_new(0x18);
  iVar1 = this->noffset;
  pCVar2->next = (CStructureEntry1 *)0x0;
  pcVar3 = strdup(nnaam);
  pCVar2->naam = pcVar3;
  if (pcVar3 == (char *)0x0) {
    ErrorOOM();
  }
  pCVar2->offset = iVar1 + offset;
  ppCVar4 = &this->mnl->next;
  if (this->mnf == (CStructureEntry1 *)0x0) {
    ppCVar4 = &this->mnf;
  }
  *ppCVar4 = pCVar2;
  this->mnl = pCVar2;
  return;
}

Assistant:

void CStructure::CopyLabel(char* nnaam, aint offset) {
	CStructureEntry1* n = new CStructureEntry1(nnaam, noffset + offset);
	if (!mnf)	mnf = n;
	else		mnl->next = n;
	mnl = n;
}